

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message ** __thiscall
google::protobuf::Reflection::MutableField<google::protobuf::Message*>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  Message **ppMVar2;
  OneofDescriptor *pOVar3;
  
  bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
  if (bVar1) {
    if ((field->field_0x1 & 0x10) == 0) {
      pOVar3 = (OneofDescriptor *)0x0;
    }
    else {
      pOVar3 = (field->scope_).containing_oneof;
      if (pOVar3 == (OneofDescriptor *)0x0) goto LAB_00423fda;
    }
    if ((pOVar3->field_count_ == 1) && ((pOVar3->fields_->field_0x1 & 2) != 0)) {
      MutableField<google::protobuf::Message*>();
LAB_00423fda:
      internal::protobuf_assumption_failed
                ("res != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb31);
    }
    *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
            (ulong)(uint)((int)((ulong)((long)pOVar3 - (long)pOVar3->containing_type_->oneof_decls_)
                               >> 3) * -0x24924924 + (this->schema_).oneof_case_offset_)) =
         field->number_;
  }
  else {
    SetHasBit(this,message,field);
  }
  VerifyFieldType<google::protobuf::Message*>(this,field);
  ppMVar2 = (Message **)MutableRawImpl(this,message,field);
  return ppMVar2;
}

Assistant:

Type* Reflection::MutableField(Message* message,
                               const FieldDescriptor* field) const {
  schema_.InRealOneof(field) ? SetOneofCase(message, field)
                             : SetHasBit(message, field);
  return MutableRaw<Type>(message, field);
}